

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_classifier.cpp
# Opt level: O1

istream * operator>>(istream *s,Am_Gesture_Classifier *cl)

{
  uint *puVar1;
  Gesture_Class *pGVar2;
  char cVar3;
  Am_Gesture_Classifier *pAVar4;
  int iVar5;
  long *plVar6;
  Am_Gesture_Classifier_Data *pAVar7;
  istream *piVar8;
  Vector pdVar9;
  Matrix ppdVar10;
  double *pdVar11;
  Gesture_Class *this;
  Vector *ppdVar12;
  long lVar13;
  long lVar14;
  bool *pbVar15;
  char check;
  int n;
  char buf [100];
  char local_ad;
  int local_ac;
  Am_Gesture_Classifier_Data *local_a8;
  Am_Gesture_Classifier *local_a0;
  long local_98;
  char local_90;
  
  local_a0 = cl;
  std::istream::get((char *)s,(long)&local_98,'d');
  plVar6 = (long *)std::istream::get((char *)s);
  if (((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) && (local_ad == '\n')
     ) {
    lVar14 = 0;
    do {
      iVar5 = strcmp((char *)&local_98,*(char **)((long)version_messages + lVar14));
      if (iVar5 == 0) {
        std::istream::operator>>((istream *)s,&local_ac);
        std::istream::get((char *)s,(long)&local_98,'d');
        plVar6 = (long *)std::istream::get((char *)s);
        if ((((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) &&
            (local_ad == '\n')) && (local_90 == '\0' && local_98 == 0x73657373616c6320)) {
          pAVar7 = (Am_Gesture_Classifier_Data *)operator_new(0x28);
          Am_Gesture_Classifier_Data::Am_Gesture_Classifier_Data(pAVar7,local_ac);
          pGVar2 = pAVar7->classes;
          cVar3 = (char)s;
          local_a8 = pAVar7;
          if (local_ac < 1) goto LAB_001a366d;
          lVar13 = 0;
          this = pGVar2;
          goto LAB_001a3600;
        }
        break;
      }
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x10);
  }
  goto LAB_001a37cb;
  while( true ) {
    Am_String::operator=(&this->name,(char *)&local_98);
    lVar13 = lVar13 + 1;
    this = this + 1;
    if (local_ac <= lVar13) break;
LAB_001a3600:
    std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar3);
    std::istream::get((char *)s,(long)&local_98,'d');
    plVar6 = (long *)std::istream::get((char *)s);
    if (((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) ||
       (local_ad != '\n')) goto LAB_001a37cb;
  }
LAB_001a366d:
  piVar8 = std::operator>>(s,&local_ad);
  if (local_ad == 'V' && ((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
    std::istream::putback(cVar3);
    if (0 < local_ac) {
      ppdVar12 = &pGVar2->w;
      lVar13 = 0;
      do {
        pdVar9 = InputVector(s);
        ppdVar12[-1] = pdVar9;
        pdVar9 = InputVector(s);
        *ppdVar12 = pdVar9;
        lVar13 = lVar13 + 1;
        ppdVar12 = ppdVar12 + 6;
      } while (lVar13 < local_ac);
    }
    pdVar9 = InputVector(s);
    if (0 < (long)local_ac) {
      pdVar11 = &pGVar2->cnst;
      lVar13 = 0;
      do {
        *pdVar11 = pdVar9[lVar13];
        lVar13 = lVar13 + 1;
        pdVar11 = pdVar11 + 6;
      } while (local_ac != lVar13);
    }
    FreeVector(pdVar9);
    if (lVar14 == 0) {
      if (0 < (long)local_ac) {
        lVar14 = 0;
        do {
          (&pGVar2->is_dot)[lVar14] = false;
          lVar14 = lVar14 + 0x30;
        } while ((long)local_ac * 0x30 != lVar14);
      }
    }
    else {
      pdVar9 = InputVector(s);
      if (0 < (long)local_ac) {
        pbVar15 = &pGVar2->is_dot;
        lVar14 = 0;
        do {
          *pbVar15 = pdVar9[lVar14] != 0.0;
          lVar14 = lVar14 + 1;
          pbVar15 = pbVar15 + 0x30;
        } while (local_ac != lVar14);
      }
      FreeVector(pdVar9);
    }
    ppdVar10 = InputMatrix(s);
    local_a8->invavgcov = ppdVar10;
    local_a8->trained = true;
  }
  else if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) == 0) {
    std::istream::putback(cVar3);
  }
  else {
    std::ios::clear((int)*(long *)(*(long *)s + -0x18) + (int)s);
  }
  pAVar4 = local_a0;
  if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) == 0) {
    pAVar7 = local_a0->data;
    if (pAVar7 != (Am_Gesture_Classifier_Data *)0x0) {
      puVar1 = &(pAVar7->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        (*(pAVar7->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
      }
    }
    pAVar4->data = local_a8;
    return s;
  }
LAB_001a37cb:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"unrecognized gesture classifier format",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  std::ios::clear((int)*(undefined8 *)(*(long *)s + -0x18) + (int)s);
  return s;
}

Assistant:

std::istream &
operator>>(std::istream &s, Am_Gesture_Classifier &cl)
{
  int n;
  char buf[100];
  Am_Gesture_Classifier_Data *cldata = nullptr;
  Am_Gesture_Classifier_Data::Gesture_Class *classes;
  int ver;
  int i;
  char check;

  // First check gesture version

  s.get(buf, sizeof(buf), '\n');
  if (!s.get(check) || check != '\n')
    goto lFail;

  for (ver = 0;; ++ver)
    if (!version_messages[ver])
      goto lFail;
    else if (!strcmp(buf, version_messages[ver]))
      break;

  // Classifier and trainer formats both begin with a class list.  E.g.:
  //
  //   3 classes
  //   cut
  //   copy
  //   paste

  s >> n;
  s.get(buf, sizeof(buf), '\n');

  if (!s.get(check) || check != '\n' || strcmp(buf, " classes"))
    goto lFail;

  // construct a new classifier with n classes
  cldata = new Am_Gesture_Classifier_Data(n);
  classes = cldata->classes;

  //AM_TRACE(n << " classes " <<std::flush);
  for (i = 0; i < n; i++) {
    s.get(buf, sizeof(buf));
    if (!s.get(check) || check != '\n')
      // class name too long
      goto lFail;
    classes[i].name = buf;
    //AM_TRACE(buf << " " <<std::flush);
  }
  //AM_TRACE(endl);

  // Now look for weights, constants, covariance matrix.
  // Weight vector begins with 'V'.  If we don't find it, assume
  // we have an untrained classifier (i.e., just a list of classes).

  if (s >> check && check == 'V') {
    s.putback(check);

    for (i = 0; i < n; i++) {
      classes[i].average = InputVector(s);
      classes[i].w = InputVector(s);
    }

    Vector v = InputVector(s);
    for (i = 0; i < n; i++)
      classes[i].cnst = v[i];
    FreeVector(v);

    if (ver > NO_DOT_VERSION) {
      Vector v = InputVector(s);
      // read in is_dot fields for each class
      for (i = 0; i < n; ++i)
        classes[i].is_dot = (v[i] != 0.0);
      FreeVector(v);
    } else {
      // initialize all is_dot fields
      for (i = 0; i < n; ++i)
        classes[i].is_dot = false;
    }

    cldata->invavgcov = InputMatrix(s);

    cldata->trained = true;
  } else if (s)
    s.putback(check);
  else
    s.clear(std::ios::goodbit);

  if (!s)
    goto lFail;

  if (cl.data)
    cl.data->Release();
  cl.data = cldata;
  return s;

lFail:
  std::cerr << "unrecognized gesture classifier format" << std::endl;
  s.clear(std::ios::badbit);
  return s;
}